

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcpyfldin_s.c
# Opt level: O0

errno_t strcpyfldin_s(char *dest,rsize_t dmax,char *src,rsize_t slen)

{
  long lVar1;
  ulong uVar2;
  char *pcVar3;
  ulong in_RCX;
  char *in_RDX;
  ulong in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  char *overlap_bumper;
  char *orig_dest;
  rsize_t orig_dmax;
  errno_t in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb4;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  bool bVar4;
  char *in_stack_ffffffffffffffb8;
  char *local_28;
  ulong local_20;
  char *local_18;
  errno_t local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (char *)0x0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffb8,
               (void *)CONCAT17(in_stack_ffffffffffffffb7,
                                CONCAT16(in_stack_ffffffffffffffb6,
                                         CONCAT24(in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0))),
               in_stack_ffffffffffffffac);
    local_c = 400;
  }
  else if (in_RSI == 0) {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffb8,
               (void *)CONCAT17(in_stack_ffffffffffffffb7,
                                CONCAT16(in_stack_ffffffffffffffb6,
                                         CONCAT24(in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0))),
               in_stack_ffffffffffffffac);
    local_c = 0x191;
  }
  else if (in_RSI < 0x10000001) {
    local_20 = in_RSI;
    local_18 = in_RDI;
    if (in_RDX == (char *)0x0) {
      for (; local_20 != 0; local_20 = local_20 - 1) {
        *local_18 = '\0';
        local_18 = local_18 + 1;
      }
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffb8,
                 (void *)CONCAT17(in_stack_ffffffffffffffb7,
                                  CONCAT16(in_stack_ffffffffffffffb6,
                                           CONCAT24(in_stack_ffffffffffffffb4,
                                                    in_stack_ffffffffffffffb0))),
                 in_stack_ffffffffffffffac);
      local_c = 400;
    }
    else if (in_RCX == 0) {
      for (; local_20 != 0; local_20 = local_20 - 1) {
        *local_18 = '\0';
        local_18 = local_18 + 1;
      }
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffb8,
                 (void *)CONCAT17(in_stack_ffffffffffffffb7,
                                  CONCAT16(in_stack_ffffffffffffffb6,
                                           CONCAT24(in_stack_ffffffffffffffb4,
                                                    in_stack_ffffffffffffffb0))),
                 in_stack_ffffffffffffffac);
      local_c = 0x191;
    }
    else if (in_RSI < in_RCX) {
      for (; local_20 != 0; local_20 = local_20 - 1) {
        *local_18 = '\0';
        local_18 = local_18 + 1;
      }
      invoke_safe_str_constraint_handler
                (in_stack_ffffffffffffffb8,
                 (void *)CONCAT17(in_stack_ffffffffffffffb7,
                                  CONCAT16(in_stack_ffffffffffffffb6,
                                           CONCAT24(in_stack_ffffffffffffffb4,
                                                    in_stack_ffffffffffffffb0))),
                 in_stack_ffffffffffffffac);
      local_c = 0x193;
    }
    else {
      local_28 = in_RDX;
      if (in_RDI < in_RDX) {
        while( true ) {
          bVar4 = false;
          if (local_20 != 0) {
            bVar4 = *local_28 != '\0';
          }
          if (bVar4 == false) goto LAB_00108f23;
          uVar2 = in_RSI;
          pcVar3 = in_RDI;
          if (local_18 == in_RDX) break;
          local_20 = local_20 - 1;
          *local_18 = *local_28;
          local_28 = local_28 + 1;
          local_18 = local_18 + 1;
        }
        while (local_18 = pcVar3, local_20 = uVar2, local_20 != 0) {
          *local_18 = '\0';
          pcVar3 = local_18 + 1;
          uVar2 = local_20 - 1;
        }
        invoke_safe_str_constraint_handler
                  (in_RDX,(void *)CONCAT17(bVar4,CONCAT16(in_stack_ffffffffffffffb6,
                                                          CONCAT24(in_stack_ffffffffffffffb4,
                                                                   in_stack_ffffffffffffffb0))),
                   in_stack_ffffffffffffffac);
        local_c = 0x194;
      }
      else {
        while( true ) {
          bVar4 = false;
          if (local_20 != 0) {
            bVar4 = *local_28 != '\0';
          }
          if (bVar4 == false) goto LAB_00108f23;
          uVar2 = in_RSI;
          pcVar3 = in_RDI;
          if (local_28 == in_RDI) break;
          local_20 = local_20 - 1;
          *local_18 = *local_28;
          local_28 = local_28 + 1;
          local_18 = local_18 + 1;
        }
        while (local_18 = pcVar3, local_20 = uVar2, local_20 != 0) {
          *local_18 = '\0';
          pcVar3 = local_18 + 1;
          uVar2 = local_20 - 1;
        }
        invoke_safe_str_constraint_handler
                  (in_RDI,(void *)CONCAT17(in_stack_ffffffffffffffb7,
                                           CONCAT16(bVar4,CONCAT24(in_stack_ffffffffffffffb4,
                                                                   in_stack_ffffffffffffffb0))),
                   in_stack_ffffffffffffffac);
        local_c = 0x194;
      }
    }
  }
  else {
    invoke_safe_str_constraint_handler
              (in_stack_ffffffffffffffb8,
               (void *)CONCAT17(in_stack_ffffffffffffffb7,
                                CONCAT16(in_stack_ffffffffffffffb6,
                                         CONCAT24(in_stack_ffffffffffffffb4,
                                                  in_stack_ffffffffffffffb0))),
               in_stack_ffffffffffffffac);
    local_c = 0x193;
  }
LAB_00108f59:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c;
LAB_00108f23:
  for (; local_20 != 0; local_20 = local_20 - 1) {
    *local_18 = '\0';
    local_18 = local_18 + 1;
  }
  local_c = 0;
  goto LAB_00108f59;
}

Assistant:

errno_t
strcpyfldin_s (char *dest, rsize_t dmax, const char *src, rsize_t slen)
{
    rsize_t orig_dmax;
    char *orig_dest;
    const char *overlap_bumper;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcpyfldin_s: dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcpyfldin_s: dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcpyfldin_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    if (src == NULL) {
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }

        invoke_safe_str_constraint_handler("strcpyfldin_s: src is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (slen == 0) {
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }

        invoke_safe_str_constraint_handler("strcpyfldin_s: slen is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (slen > dmax) {
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }

        invoke_safe_str_constraint_handler("strcpyfldin_s: slen exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }


    /* hold base of dest in case src was not copied */
    orig_dmax = dmax;
    orig_dest = dest;

    if (dest < src) {
        overlap_bumper = src;

        while (dmax > 0 && *src) {

            if (dest == overlap_bumper) {
                dmax = orig_dmax;
                dest = orig_dest;

                /* null string to eliminate partial copy */
                while (dmax) { *dest = '\0'; dmax--; dest++; }

                invoke_safe_str_constraint_handler(
                          "strcpyfldin_s: overlapping objects",
                           NULL, ESOVRLP);
                return (ESOVRLP);
            }

            dmax--;
            *dest++ = *src++;
        }

    } else {
        overlap_bumper = dest;

        while (dmax > 0 && *src) {

            if (src == overlap_bumper) {
                dmax = orig_dmax;
                dest = orig_dest;

                /* null string to eliminate partial copy */
                while (dmax) { *dest = '\0'; dmax--; dest++; }

                invoke_safe_str_constraint_handler(
                          "strcpyfldin_s: overlapping objects",
                           NULL, ESOVRLP);
                return (ESOVRLP);
            }

            dmax--;
            *dest++ = *src++;
        }
    }

    /*
     * finish filling in the field with nulls if there is slack space
     */
    while (dmax) { *dest = '\0'; dmax--; dest++; }

    return (EOK);
}